

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void usage_exit(int exit_code)

{
  FILE *__stream;
  undefined8 *puVar1;
  char **ppcVar2;
  char **ppcVar3;
  char *pcVar4;
  
  if (exit_code == 0) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  __stream = (FILE *)*puVar1;
  pcVar4 = "./basic";
  if (program_name != (char *)0x0) {
    pcVar4 = program_name;
  }
  fprintf(__stream,
          "Retro basic interpreter, for testing the chipemu library\n%s\nBuilt: Apr 27 2025 00:37:02\nUsage:\n%s [-h] [-t path] <machine type>\n  -h\n  --help          print this very helpful text, and exit\n  -s              print some statistics on exit\n  -t path\n  --trace path    print trace to file at `path`\n  <machine type>  basic interpreter to emulate, available choices are:\n"
          ,"https://github.com/GBuella/chipemu",pcVar4);
  ppcVar2 = testbench::machine::availability::begin();
  ppcVar3 = testbench::machine::availability::end();
  for (; ppcVar2 != ppcVar3; ppcVar2 = ppcVar2 + 1) {
    fprintf(__stream,"                     %s\n",*ppcVar2);
  }
  exit(exit_code);
}

Assistant:

static void usage_exit(int exit_code)
{
    FILE *output = ((exit_code == EXIT_SUCCESS) ? stdout : stderr);

    fprintf(output, "Retro basic interpreter, for testing the chipemu library\n"
     "%s\n"
     "Built: " __DATE__ " " __TIME__ "\n"
     "Usage:\n"
     "%s [-h] [-t path] <machine type>\n"
     "  -h\n"
     "  --help          print this very helpful text, and exit\n"
     "  -s              print some statistics on exit\n"
     "  -t path\n"
     "  --trace path    print trace to file at `path`\n"
     "  <machine type>  basic interpreter to emulate, available choices are:\n",
     project_url,
     program_name ? program_name : "./basic");
    for (auto machine : testbench::machine::available) {
        fprintf(output, "                     %s\n", machine);
    }
    exit(exit_code);
}